

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.h
# Opt level: O2

Index * __thiscall Cache<Index>::find(Cache<Index> *this,function<bool_(const_Index_&)> *func)

{
  __normal_iterator<Cache<Index>::Entry_*,_std::vector<Cache<Index>::Entry,_std::allocator<Cache<Index>::Entry>_>_>
  _Var1;
  
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<Cache<Index>::Entry*,std::vector<Cache<Index>::Entry,std::allocator<Cache<Index>::Entry>>>,__gnu_cxx::__ops::_Iter_pred<Cache<Index>::find(std::function<bool(Index_const&)>)::_lambda(Cache<Index>::Entry_const&)_1_>>
                    ((this->entries).
                     super__Vector_base<Cache<Index>::Entry,_std::allocator<Cache<Index>::Entry>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (this->entries).
                     super__Vector_base<Cache<Index>::Entry,_std::allocator<Cache<Index>::Entry>_>.
                     _M_impl.super__Vector_impl_data._M_finish,func);
  if (_Var1._M_current ==
      (this->entries).super__Vector_base<Cache<Index>::Entry,_std::allocator<Cache<Index>::Entry>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    _Var1._M_current = (Entry *)0x0;
  }
  return &(_Var1._M_current)->data;
}

Assistant:

T* find(std::function<bool(const T& t)> func) {
			auto item = std::find_if(entries.begin(), entries.end(), [&](const Entry& entry) {
				return func(entry.data);
			});

			if (item != entries.end()) {
				return &item->data;
			}
			return nullptr;
		}